

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall pugi::xml_node::prepend_move(xml_node *this,xml_node *moved)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  bool bVar4;
  xml_node_struct *in_RAX;
  xml_node_struct **ppxVar5;
  xml_node_struct *pxVar6;
  xml_node_struct **ppxVar7;
  xml_node local_18;
  
  local_18._root = in_RAX;
  bVar4 = impl::anon_unknown_0::allow_move(this,moved);
  if (bVar4) {
    pxVar1 = moved->_root;
    pxVar2 = pxVar1->parent;
    pxVar3 = pxVar1->next_sibling;
    pxVar6 = pxVar3;
    if ((pxVar3 != (xml_node_struct *)0x0) ||
       (pxVar6 = pxVar2->first_child, pxVar6 != (xml_node_struct *)0x0)) {
      pxVar6->prev_sibling_c = pxVar1->prev_sibling_c;
    }
    ppxVar7 = &pxVar1->prev_sibling_c;
    ppxVar5 = &pxVar2->first_child;
    if (pxVar1->prev_sibling_c->next_sibling != (xml_node_struct *)0x0) {
      ppxVar5 = &pxVar1->prev_sibling_c->next_sibling;
    }
    *ppxVar5 = pxVar3;
    pxVar2 = this->_root;
    pxVar1->parent = pxVar2;
    pxVar3 = pxVar2->first_child;
    if (pxVar3 != (xml_node_struct *)0x0) {
      *ppxVar7 = pxVar3->prev_sibling_c;
      ppxVar7 = &pxVar3->prev_sibling_c;
    }
    *ppxVar7 = pxVar1;
    pxVar1->next_sibling = pxVar3;
    pxVar2->first_child = pxVar1;
    local_18 = (xml_node)moved->_root;
  }
  else {
    xml_node(&local_18);
  }
  return (xml_node)local_18._root;
}

Assistant:

PUGI__FN xml_node xml_node::prepend_move(const xml_node& moved)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();

		impl::remove_node(moved._root);
		impl::prepend_node(moved._root, _root);

		return moved;
	}